

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

uint32_t EthUdpPort::IP_ULong(string *IPaddr)

{
  char *__cp;
  uint32_t local_18 [2];
  unsigned_long ret;
  string *IPaddr_local;
  
  ret = (unsigned_long)IPaddr;
  __cp = (char *)std::__cxx11::string::c_str();
  inet_pton(2,__cp,local_18);
  return local_18[0];
}

Assistant:

uint32_t EthUdpPort::IP_ULong(const std::string &IPaddr)
{
    unsigned long ret;
#ifdef _MSC_VER
    // Windows does not provide inet_pton prior to Vista, so we use inet_addr.
    ret = inet_addr(IPaddr.c_str());
#else
    inet_pton(AF_INET, IPaddr.c_str(), reinterpret_cast<struct in_addr *>(&ret));
#endif
    return ret;
}